

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserSharedInputState.hpp
# Opt level: O3

void __thiscall antlr::ParserInputState::~ParserInputState(ParserInputState *this)

{
  ~ParserInputState(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~ParserInputState()
	{
		if (inputResponsible)
			delete input;
	}